

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O2

Type * __thiscall
slang::ast::Compilation::getType
          (Compilation *this,bitwidth_t width,bitmask<slang::ast::IntegralFlags> flags)

{
  group_type_pointer pgVar1;
  value_type_pointer ppVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  value_type *elements_1;
  ulong hash;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  uchar uVar13;
  uchar uVar14;
  uchar uVar15;
  byte bVar16;
  uint32_t key;
  PackedArrayType *type;
  try_emplace_args_t local_95;
  uint local_94;
  PackedArrayType *local_90;
  bitwidth_t local_84;
  table_core<boost::unordered::detail::foa::flat_map_types<unsigned_int,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<unsigned_int,void>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,slang::ast::Type_const*>>>
  *local_80;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  uchar local_68;
  uchar uStack_67;
  uchar uStack_66;
  uchar uStack_65;
  uchar uStack_64;
  uchar uStack_63;
  uchar uStack_62;
  uchar uStack_61;
  uchar uStack_60;
  uchar uStack_5f;
  uchar uStack_5e;
  uchar uStack_5d;
  uchar uStack_5c;
  uchar uStack_5b;
  uchar uStack_5a;
  byte bStack_59;
  uchar local_58;
  uchar uStack_57;
  uchar uStack_56;
  byte bStack_55;
  uchar uStack_54;
  uchar uStack_53;
  uchar uStack_52;
  byte bStack_51;
  uchar uStack_50;
  uchar uStack_4f;
  uchar uStack_4e;
  byte bStack_4d;
  uchar uStack_4c;
  uchar uStack_4b;
  uchar uStack_4a;
  byte bStack_49;
  locator local_48;
  
  uVar10 = (uint)flags.m_bits << 0x18 | width;
  hash = SUB168(ZEXT416(uVar10) * ZEXT816(0x9e3779b97f4a7c15),8) ^
         SUB168(ZEXT416(uVar10) * ZEXT816(0x9e3779b97f4a7c15),0);
  uVar5 = hash >> ((byte)(this->vectorTypeCache).table_.
                         super_table_core_impl<boost::unordered::detail::foa::flat_map_types<unsigned_int,_const_slang::ast::Type_*>,_slang::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_slang::ast::Type_*>_>_>
                         .arrays.groups_size_index & 0x3f);
  local_80 = (table_core<boost::unordered::detail::foa::flat_map_types<unsigned_int,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<unsigned_int,void>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,slang::ast::Type_const*>>>
              *)&this->vectorTypeCache;
  local_78 = (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
               ::match_word(unsigned_long)::word)[hash & 0xff];
  ppVar2 = (this->vectorTypeCache).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<unsigned_int,_const_slang::ast::Type_*>,_slang::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_slang::ast::Type_*>_>_>
           .arrays.elements_;
  uVar3 = (this->vectorTypeCache).table_.
          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<unsigned_int,_const_slang::ast::Type_*>,_slang::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_slang::ast::Type_*>_>_>
          .arrays.groups_size_mask;
  uVar8 = 0;
  do {
    pgVar1 = (this->vectorTypeCache).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<unsigned_int,_const_slang::ast::Type_*>,_slang::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_slang::ast::Type_*>_>_>
             .arrays.groups_ + uVar5;
    local_58 = pgVar1->m[0].n;
    uStack_57 = pgVar1->m[1].n;
    uStack_56 = pgVar1->m[2].n;
    bStack_55 = pgVar1->m[3].n;
    uStack_54 = pgVar1->m[4].n;
    uStack_53 = pgVar1->m[5].n;
    uStack_52 = pgVar1->m[6].n;
    bStack_51 = pgVar1->m[7].n;
    uStack_50 = pgVar1->m[8].n;
    uStack_4f = pgVar1->m[9].n;
    uStack_4e = pgVar1->m[10].n;
    bStack_4d = pgVar1->m[0xb].n;
    uStack_4c = pgVar1->m[0xc].n;
    uStack_4b = pgVar1->m[0xd].n;
    uStack_4a = pgVar1->m[0xe].n;
    bStack_49 = pgVar1->m[0xf].n;
    uVar13 = (uchar)local_78;
    auVar11[0] = -(local_58 == uVar13);
    uVar14 = (uchar)((uint)local_78 >> 8);
    auVar11[1] = -(uStack_57 == uVar14);
    uVar15 = (uchar)((uint)local_78 >> 0x10);
    auVar11[2] = -(uStack_56 == uVar15);
    bVar16 = (byte)((uint)local_78 >> 0x18);
    auVar11[3] = -(bStack_55 == bVar16);
    auVar11[4] = -(uStack_54 == uVar13);
    auVar11[5] = -(uStack_53 == uVar14);
    auVar11[6] = -(uStack_52 == uVar15);
    auVar11[7] = -(bStack_51 == bVar16);
    auVar11[8] = -(uStack_50 == uVar13);
    auVar11[9] = -(uStack_4f == uVar14);
    auVar11[10] = -(uStack_4e == uVar15);
    auVar11[0xb] = -(bStack_4d == bVar16);
    auVar11[0xc] = -(uStack_4c == uVar13);
    auVar11[0xd] = -(uStack_4b == uVar14);
    auVar11[0xe] = -(uStack_4a == uVar15);
    auVar11[0xf] = -(bStack_49 == bVar16);
    for (uVar9 = (uint)(ushort)((ushort)(SUB161(auVar11 >> 7,0) & 1) |
                                (ushort)(SUB161(auVar11 >> 0xf,0) & 1) << 1 |
                                (ushort)(SUB161(auVar11 >> 0x17,0) & 1) << 2 |
                                (ushort)(SUB161(auVar11 >> 0x1f,0) & 1) << 3 |
                                (ushort)(SUB161(auVar11 >> 0x27,0) & 1) << 4 |
                                (ushort)(SUB161(auVar11 >> 0x2f,0) & 1) << 5 |
                                (ushort)(SUB161(auVar11 >> 0x37,0) & 1) << 6 |
                                (ushort)(SUB161(auVar11 >> 0x3f,0) & 1) << 7 |
                                (ushort)(SUB161(auVar11 >> 0x47,0) & 1) << 8 |
                                (ushort)(SUB161(auVar11 >> 0x4f,0) & 1) << 9 |
                                (ushort)(SUB161(auVar11 >> 0x57,0) & 1) << 10 |
                                (ushort)(SUB161(auVar11 >> 0x5f,0) & 1) << 0xb |
                                (ushort)(SUB161(auVar11 >> 0x67,0) & 1) << 0xc |
                                (ushort)(SUB161(auVar11 >> 0x6f,0) & 1) << 0xd |
                               (ushort)(SUB161(auVar11 >> 0x77,0) & 1) << 0xe); uVar9 != 0;
        uVar9 = uVar9 - 1 & uVar9) {
      iVar4 = 0;
      if (uVar9 != 0) {
        for (; (uVar9 >> iVar4 & 1) == 0; iVar4 = iVar4 + 1) {
        }
      }
      if (uVar10 == *(uint *)((long)&ppVar2[uVar5 * 0xf].first + (ulong)(uint)(iVar4 << 4))) {
        return (Type *)*(PackedArrayType **)
                        ((long)&ppVar2[uVar5 * 0xf].second + (ulong)(uint)(iVar4 << 4));
      }
    }
    bVar16 = (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
               ::is_not_overflowed(unsigned_long)::shift)[(uint)hash & 7];
    if ((bVar16 & bStack_49) == 0) break;
    lVar6 = uVar5 + uVar8;
    uVar8 = uVar8 + 1;
    uVar5 = lVar6 + 1U & uVar3;
  } while (uVar8 <= uVar3);
  local_48.pg._0_4_ = width - 1;
  local_48.pg._4_4_ = 0;
  local_94 = uVar10;
  local_84 = width;
  uStack_74 = local_78;
  uStack_70 = local_78;
  uStack_6c = local_78;
  local_90 = BumpAllocator::
             emplace<slang::ast::PackedArrayType,slang::ast::Type_const&,slang::ConstantRange,unsigned_int&>
                       (&this->super_BumpAllocator,this->scalarTypeTable[flags.m_bits & 7],
                        (ConstantRange *)&local_48,&local_84);
  uVar8 = hash >> ((byte)(this->vectorTypeCache).table_.
                         super_table_core_impl<boost::unordered::detail::foa::flat_map_types<unsigned_int,_const_slang::ast::Type_*>,_slang::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_slang::ast::Type_*>_>_>
                         .arrays.groups_size_index & 0x3f);
  uVar3 = (this->vectorTypeCache).table_.
          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<unsigned_int,_const_slang::ast::Type_*>,_slang::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_slang::ast::Type_*>_>_>
          .arrays.groups_size_mask;
  uVar7 = 0;
  uVar5 = uVar8;
  do {
    pgVar1 = (this->vectorTypeCache).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<unsigned_int,_const_slang::ast::Type_*>,_slang::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_slang::ast::Type_*>_>_>
             .arrays.groups_ + uVar5;
    local_68 = pgVar1->m[0].n;
    uStack_67 = pgVar1->m[1].n;
    uStack_66 = pgVar1->m[2].n;
    uStack_65 = pgVar1->m[3].n;
    uStack_64 = pgVar1->m[4].n;
    uStack_63 = pgVar1->m[5].n;
    uStack_62 = pgVar1->m[6].n;
    uStack_61 = pgVar1->m[7].n;
    uStack_60 = pgVar1->m[8].n;
    uStack_5f = pgVar1->m[9].n;
    uStack_5e = pgVar1->m[10].n;
    uStack_5d = pgVar1->m[0xb].n;
    uStack_5c = pgVar1->m[0xc].n;
    uStack_5b = pgVar1->m[0xd].n;
    uStack_5a = pgVar1->m[0xe].n;
    bStack_59 = pgVar1->m[0xf].n;
    auVar12[0] = -(local_68 == (uchar)local_78);
    auVar12[1] = -(uStack_67 == local_78._1_1_);
    auVar12[2] = -(uStack_66 == local_78._2_1_);
    auVar12[3] = -(uStack_65 == local_78._3_1_);
    auVar12[4] = -(uStack_64 == (uchar)uStack_74);
    auVar12[5] = -(uStack_63 == uStack_74._1_1_);
    auVar12[6] = -(uStack_62 == uStack_74._2_1_);
    auVar12[7] = -(uStack_61 == uStack_74._3_1_);
    auVar12[8] = -(uStack_60 == (uchar)uStack_70);
    auVar12[9] = -(uStack_5f == uStack_70._1_1_);
    auVar12[10] = -(uStack_5e == uStack_70._2_1_);
    auVar12[0xb] = -(uStack_5d == uStack_70._3_1_);
    auVar12[0xc] = -(uStack_5c == (uchar)uStack_6c);
    auVar12[0xd] = -(uStack_5b == uStack_6c._1_1_);
    auVar12[0xe] = -(uStack_5a == uStack_6c._2_1_);
    auVar12[0xf] = -(bStack_59 == uStack_6c._3_1_);
    for (uVar9 = (uint)(ushort)((ushort)(SUB161(auVar12 >> 7,0) & 1) |
                                (ushort)(SUB161(auVar12 >> 0xf,0) & 1) << 1 |
                                (ushort)(SUB161(auVar12 >> 0x17,0) & 1) << 2 |
                                (ushort)(SUB161(auVar12 >> 0x1f,0) & 1) << 3 |
                                (ushort)(SUB161(auVar12 >> 0x27,0) & 1) << 4 |
                                (ushort)(SUB161(auVar12 >> 0x2f,0) & 1) << 5 |
                                (ushort)(SUB161(auVar12 >> 0x37,0) & 1) << 6 |
                                (ushort)(SUB161(auVar12 >> 0x3f,0) & 1) << 7 |
                                (ushort)(SUB161(auVar12 >> 0x47,0) & 1) << 8 |
                                (ushort)(SUB161(auVar12 >> 0x4f,0) & 1) << 9 |
                                (ushort)(SUB161(auVar12 >> 0x57,0) & 1) << 10 |
                                (ushort)(SUB161(auVar12 >> 0x5f,0) & 1) << 0xb |
                                (ushort)(SUB161(auVar12 >> 0x67,0) & 1) << 0xc |
                                (ushort)(SUB161(auVar12 >> 0x6f,0) & 1) << 0xd |
                               (ushort)(SUB161(auVar12 >> 0x77,0) & 1) << 0xe); uVar9 != 0;
        uVar9 = uVar9 - 1 & uVar9) {
      iVar4 = 0;
      if (uVar9 != 0) {
        for (; (uVar9 >> iVar4 & 1) == 0; iVar4 = iVar4 + 1) {
        }
      }
      if (uVar10 == *(uint *)((long)&(this->vectorTypeCache).table_.
                                     super_table_core_impl<boost::unordered::detail::foa::flat_map_types<unsigned_int,_const_slang::ast::Type_*>,_slang::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_slang::ast::Type_*>_>_>
                                     .arrays.elements_[uVar5 * 0xf].first +
                             (ulong)(uint)(iVar4 << 4))) {
        return (Type *)local_90;
      }
    }
    if ((bVar16 & bStack_59) == 0) break;
    lVar6 = uVar5 + uVar7;
    uVar7 = uVar7 + 1;
    uVar5 = lVar6 + 1U & uVar3;
  } while (uVar7 <= uVar3);
  if ((this->vectorTypeCache).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<unsigned_int,_const_slang::ast::Type_*>,_slang::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_slang::ast::Type_*>_>_>
      .size_ctrl.size <
      (this->vectorTypeCache).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<unsigned_int,_const_slang::ast::Type_*>,_slang::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_slang::ast::Type_*>_>_>
      .size_ctrl.ml) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<unsigned_int,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<unsigned_int,void>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,slang::ast::Type_const*>>>
    ::
    unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,unsigned_int&,slang::ast::PackedArrayType*&>
              (&local_48,local_80,uVar8,hash,&local_95,&local_94,&local_90);
  }
  else {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<unsigned_int,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<unsigned_int,void>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,slang::ast::Type_const*>>>
    ::
    unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,unsigned_int&,slang::ast::PackedArrayType*&>
              (&local_48,local_80,hash,&local_95,&local_94,&local_90);
  }
  return (Type *)local_90;
}

Assistant:

const Type& Compilation::getType(bitwidth_t width, bitmask<IntegralFlags> flags) {
    SLANG_ASSERT(width > 0 && width <= SVInt::MAX_BITS);
    uint32_t key = width;
    key |= uint32_t(flags.bits()) << SVInt::BITWIDTH_BITS;
    auto it = vectorTypeCache.find(key);
    if (it != vectorTypeCache.end())
        return *it->second;

    SLANG_ASSERT(!isFrozen());

    auto type = emplace<PackedArrayType>(getScalarType(flags), ConstantRange{int32_t(width - 1), 0},
                                         width);
    vectorTypeCache.emplace_hint(it, key, type);
    return *type;
}